

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void freeSection(Section *section,void *arg)

{
  Section *pSVar1;
  ulong uVar2;
  long lVar3;
  
  do {
    pSVar1 = section->nextu;
    free(section->name);
    if (section->type == SECTTYPE_INVALID) {
      __assert_fail("type != SECTTYPE_INVALID",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/include/linkdefs.hpp"
                    ,0x65,"bool sect_HasData(enum SectionType)");
    }
    if ((section->type & ~SECTTYPE_VRAM) == SECTTYPE_ROMX) {
      free(section->data);
      if (section->nbPatches != 0) {
        lVar3 = 0x20;
        uVar2 = 0;
        do {
          free(*(void **)((long)&section->patches->src + lVar3));
          uVar2 = uVar2 + 1;
          lVar3 = lVar3 + 0x30;
        } while (uVar2 < section->nbPatches);
      }
      free(section->patches);
    }
    free(section->symbols);
    free(section);
    section = pSVar1;
  } while (pSVar1 != (Section *)0x0);
  return;
}

Assistant:

static void freeSection(struct Section *section, void *arg)
{
	(void)arg;

	do {
		struct Section *next = section->nextu;

		free(section->name);
		if (sect_HasData(section->type)) {
			free(section->data);
			for (uint32_t i = 0; i < section->nbPatches; i++)
				free(section->patches[i].rpnExpression);
			free(section->patches);
		}
		free(section->symbols);
		free(section);

		section = next;
	} while (section);
}